

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O3

bool __thiscall glslang::HlslGrammar::acceptMatrixTemplateType(HlslGrammar *this,TType *type)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  char *pcVar4;
  HlslParseContext *pHVar5;
  _func_int **pp_Var6;
  TPrecisionQualifier precision;
  TBasicType basicType;
  TIntermTyped *cols;
  TIntermTyped *rows;
  
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokMatrix);
  if (!bVar1) {
    return false;
  }
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftAngle);
  if (!bVar1) {
    TType::TType(type,EbtFloat,EvqTemporary,0,4,4,false);
    return true;
  }
  bVar1 = acceptTemplateVecMatBasicType(this,&basicType,&precision);
  if (!bVar1) {
    pHVar5 = this->parseContext;
    pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar4 = "scalar type";
    goto LAB_0042a821;
  }
  bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
  if (bVar1) {
    bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
    if (bVar1) {
      bVar1 = acceptLiteral(this,&rows);
      if (!bVar1) {
        return false;
      }
      bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokComma);
      if (!bVar1) goto LAB_0042a7e7;
      bVar1 = HlslTokenStream::peekTokenClass(&this->super_HlslTokenStream,EHTokIntConstant);
      if (bVar1) {
        bVar1 = acceptLiteral(this,&cols);
        if (!bVar1) {
          return false;
        }
        iVar2 = (*(rows->super_TIntermNode)._vptr_TIntermNode[5])();
        iVar2 = **(int **)(*(long *)(CONCAT44(extraout_var,iVar2) + 0xc0) + 8);
        iVar3 = (*(cols->super_TIntermNode)._vptr_TIntermNode[5])();
        TType::TType(type,basicType,EvqTemporary,precision,0,iVar2,
                     **(int **)(*(long *)(CONCAT44(extraout_var_00,iVar3) + 0xc0) + 8),false);
        bVar1 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightAngle);
        if (bVar1) {
          return true;
        }
        pHVar5 = this->parseContext;
        pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
        pcVar4 = "right angle bracket";
        goto LAB_0042a821;
      }
    }
    pHVar5 = this->parseContext;
    pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar4 = "literal integer";
  }
  else {
LAB_0042a7e7:
    pHVar5 = this->parseContext;
    pp_Var6 = (pHVar5->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions;
    pcVar4 = ",";
  }
LAB_0042a821:
  (*pp_Var6[0x2d])(pHVar5,&(this->super_HlslTokenStream).token,"Expected",pcVar4,"");
  return false;
}

Assistant:

bool HlslGrammar::acceptMatrixTemplateType(TType& type)
{
    if (! acceptTokenClass(EHTokMatrix))
        return false;

    if (! acceptTokenClass(EHTokLeftAngle)) {
        // in HLSL, 'matrix' alone means float4x4.
        new(&type) TType(EbtFloat, EvqTemporary, 0, 4, 4);
        return true;
    }

    TBasicType basicType;
    TPrecisionQualifier precision;
    if (! acceptTemplateVecMatBasicType(basicType, precision)) {
        expected("scalar type");
        return false;
    }

    // COMMA
    if (! acceptTokenClass(EHTokComma)) {
        expected(",");
        return false;
    }

    // integer rows
    if (! peekTokenClass(EHTokIntConstant)) {
        expected("literal integer");
        return false;
    }

    TIntermTyped* rows;
    if (! acceptLiteral(rows))
        return false;

    // COMMA
    if (! acceptTokenClass(EHTokComma)) {
        expected(",");
        return false;
    }

    // integer cols
    if (! peekTokenClass(EHTokIntConstant)) {
        expected("literal integer");
        return false;
    }

    TIntermTyped* cols;
    if (! acceptLiteral(cols))
        return false;

    new(&type) TType(basicType, EvqTemporary, precision, 0,
                     rows->getAsConstantUnion()->getConstArray()[0].getIConst(),
                     cols->getAsConstantUnion()->getConstArray()[0].getIConst());

    if (!acceptTokenClass(EHTokRightAngle)) {
        expected("right angle bracket");
        return false;
    }

    return true;
}